

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprintint.h
# Opt level: O1

int print_uint16(uint16_t n,char *p)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  undefined6 in_register_0000003a;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = CONCAT62(in_register_0000003a,n);
  uVar4 = (uint)uVar5;
  if (uVar4 < 1000) {
    uVar2 = 3;
    if (99 < n) goto LAB_001276a1;
    bVar6 = n < 10;
    iVar1 = 1;
  }
  else {
    bVar6 = n < 10000;
    iVar1 = 4;
  }
  uVar2 = (iVar1 + 1) - (uint)bVar6;
LAB_001276a1:
  pcVar3 = p + uVar2;
  p[uVar2] = '\0';
  if ((uVar2 & 1) != 0) {
    if (uVar2 != 1) {
      if (uVar2 != 3) {
        if (uVar2 != 5) {
          return uVar2;
        }
        *(undefined2 *)(pcVar3 + -2) =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (ulong)(uVar4 + (int)((uVar5 & 0xffffffff) * 0x28f5c29 >> 0x20) * -100) * 2);
        pcVar3 = pcVar3 + -2;
        uVar5 = (ulong)((n >> 2) / 0x19);
      }
      uVar4 = (uint)((uVar5 & 0xffff) >> 2) / 0x19;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (ulong)((int)uVar5 + uVar4 * -100 & 0xffff) * 2);
      pcVar3 = pcVar3 + -2;
      uVar5 = (ulong)uVar4;
    }
    pcVar3[-1] = (char)uVar5 + '0';
    return uVar2;
  }
  if (uVar2 != 2) {
    if (uVar2 != 4) {
      return uVar2;
    }
    *(undefined2 *)(pcVar3 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (ulong)(uVar4 + (int)((uVar5 & 0xffffffff) * 0x28f5c29 >> 0x20) * -100) * 2);
    pcVar3 = pcVar3 + -2;
    uVar5 = (ulong)((n >> 2) / 0x19);
  }
  *(undefined2 *)(pcVar3 + -2) =
       *(undefined2 *)
        (
        "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
        + (ulong)((int)uVar5 + ((uint)((uVar5 & 0xffff) >> 2) / 0x19) * -100 & 0xffff) * 2);
  return uVar2;
}

Assistant:

static int print_uint16(uint16_t n, char *p)
{
    int k = 0;
    const char *dp;

    if (n >= 1000) {
        if(n >= 10000) {
            k = 5;
        } else {
            k = 4;
        }
    } else {
        if(n >= 100) {
            k = 3;
        } else if(n >= 10) {
            k = 2;
        } else {
            k = 1;
        }
    }
    p += k;
    *p = '\0';
    if (k & 1) {
        switch (k) {
        case 5:
            __print_stage();
	    pattribute(fallthrough);
        case 3:
            __print_stage();
	    pattribute(fallthrough);
        case 1:
            p[-1] = (char)n + '0';
        }
    } else {
        switch (k) {
        case 4:
            __print_stage();
	    pattribute(fallthrough);
        case 2:
            __print_stage();
        }
    }
    return k;
}